

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict
get_int_node_from_repr
          (c2m_ctx_t c2m_ctx,char *repr,char **stop,int base,int uns_p,int long_p,int llong_p,
          pos_t pos)

{
  ulonglong ul;
  node_t_conflict pnVar1;
  node_code_t nVar2;
  
  ul = strtoull(repr,stop,base);
  if (llong_p == 0) {
    if (long_p == 0) {
      if (uns_p == 0) {
        if (0x7fffffff < ul) {
          if (ul >> 0x20 == 0 && base != 10) {
            pnVar1 = new_u_node(c2m_ctx,ul,pos);
            return pnVar1;
          }
          if (-1 < (long)ul) {
            pnVar1 = new_l_node(c2m_ctx,ul,pos);
            return pnVar1;
          }
          pnVar1 = new_ul_node(c2m_ctx,ul,pos);
          return pnVar1;
        }
        nVar2 = N_I;
        goto LAB_001929d8;
      }
      if (ul >> 0x20 != 0) goto LAB_00192a38;
      nVar2 = N_U;
    }
    else if ((long)ul < 0 || uns_p != 0) {
LAB_00192a38:
      nVar2 = N_UL;
    }
    else {
      nVar2 = N_L;
    }
    pnVar1 = new_node(c2m_ctx,nVar2);
  }
  else {
    if ((uns_p == 0) && (-1 < (long)ul || base == 10)) {
      nVar2 = N_LL;
    }
    else {
      nVar2 = N_ULL;
    }
LAB_001929d8:
    pnVar1 = new_node(c2m_ctx,nVar2);
  }
  add_pos(c2m_ctx,pnVar1,pos);
  (pnVar1->u).ul = ul;
  return pnVar1;
}

Assistant:

static node_t get_int_node_from_repr (c2m_ctx_t c2m_ctx, const char *repr, char **stop, int base,
                                      int uns_p, int long_p, int llong_p, pos_t pos) {
  mir_ullong ull = strtoull (repr, stop, base);

  if (llong_p) {
    if (!uns_p && (base == 10 || ull <= MIR_LLONG_MAX)) return new_ll_node (c2m_ctx, ull, pos);
    return new_ull_node (c2m_ctx, ull, pos);
  }
  if (long_p) {
    if (!uns_p && ull <= MIR_LONG_MAX) return new_l_node (c2m_ctx, (long) ull, pos);
    if (ull <= MIR_ULONG_MAX) return new_ul_node (c2m_ctx, (unsigned long) ull, pos);
    if (!uns_p && (base == 10 || ull <= MIR_LLONG_MAX)) return new_ll_node (c2m_ctx, ull, pos);
    return new_ull_node (c2m_ctx, ull, pos);
  }
  if (uns_p) {
    if (ull <= MIR_UINT_MAX) return new_u_node (c2m_ctx, (unsigned long) ull, pos);
    if (ull <= MIR_ULONG_MAX) return new_ul_node (c2m_ctx, (unsigned long) ull, pos);
    return new_ull_node (c2m_ctx, ull, pos);
  }
  if (ull <= MIR_INT_MAX) return new_i_node (c2m_ctx, (long) ull, pos);
  if (base != 10 && ull <= MIR_UINT_MAX) return new_u_node (c2m_ctx, (unsigned long) ull, pos);
  if (ull <= MIR_LONG_MAX) return new_l_node (c2m_ctx, (long) ull, pos);
  if (ull <= MIR_ULONG_MAX) return new_ul_node (c2m_ctx, (unsigned long) ull, pos);
  if (base == 10 || ull <= MIR_LLONG_MAX) return new_ll_node (c2m_ctx, ull, pos);
  return new_ull_node (c2m_ctx, ull, pos);
}